

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void AddCleanFile(cmMakefile *makefile,string *fileName)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_MAKE_CLEAN_FILES",&local_39);
  cmMakefile::AppendProperty(makefile,&local_38,(fileName->_M_dataplus)._M_p,false);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void AddCleanFile(cmMakefile* makefile, std::string const& fileName)
{
  makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES", fileName.c_str(),
                           false);
}